

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O3

int rfc5444_writer_register_msgcontentprovider
              (rfc5444_writer *writer,rfc5444_writer_content_provider *cpr,
              rfc5444_writer_tlvtype *addrtlvs,size_t addrtlvs_count)

{
  int iVar1;
  rfc5444_writer_message *msg;
  
  if (writer->_state == RFC5444_WRITER_NONE) {
    msg = _get_message(writer,cpr->msg_type);
    if (msg == (rfc5444_writer_message *)0x0) {
      iVar1 = -1;
    }
    else {
      if (addrtlvs_count != 0) {
        do {
          _register_addrtlvtype(writer,msg,addrtlvs);
          addrtlvs = addrtlvs + 1;
          addrtlvs_count = addrtlvs_count - 1;
        } while (addrtlvs_count != 0);
      }
      cpr->creator = msg;
      (cpr->_provider_node).key = cpr;
      avl_insert(&msg->_provider_tree,&cpr->_provider_node);
      iVar1 = 0;
    }
    return iVar1;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x156,
                "int rfc5444_writer_register_msgcontentprovider(struct rfc5444_writer *, struct rfc5444_writer_content_provider *, struct rfc5444_writer_tlvtype *, size_t)"
               );
}

Assistant:

int
rfc5444_writer_register_msgcontentprovider(struct rfc5444_writer *writer, struct rfc5444_writer_content_provider *cpr,
  struct rfc5444_writer_tlvtype *addrtlvs, size_t addrtlvs_count) {
  struct rfc5444_writer_message *msg;
  size_t i;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif
  /* first allocate the message if necessary */
  if ((msg = _get_message(writer, cpr->msg_type)) == NULL) {
    return -1;
  }

  for (i = 0; i < addrtlvs_count; i++) {
    _register_addrtlvtype(writer, msg, &addrtlvs[i]);
  }

  cpr->creator = msg;
  cpr->_provider_node.key = &cpr->priority;

  avl_insert(&msg->_provider_tree, &cpr->_provider_node);
  return 0;
}